

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

bool duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::TryInitializeNextBatch
               (ClientContext *context,MultiFileBindData *bind_data,MultiFileLocalState *scan_data,
               MultiFileGlobalState *gstate)

{
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  *this;
  idx_t iVar1;
  __int_type _Var2;
  __int_type _Var3;
  bool bVar4;
  reference this_00;
  type reader_data;
  type pGVar5;
  type lstate_p;
  InternalException *this_01;
  ParquetReadGlobalState *gstate_1;
  allocator local_81;
  MultiFileLocalState *local_80;
  unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
  *local_78;
  unique_lock<std::mutex> parallel_lock;
  string local_58;
  
  ::std::unique_lock<std::mutex>::unique_lock(&parallel_lock,&gstate->lock);
  this = &gstate->global_state;
  local_78 = &scan_data->local_state;
  local_80 = scan_data;
  do {
    if (gstate->error_opening_file != false) {
LAB_01eae0e7:
      bVar4 = false;
LAB_01eae0e9:
      ::std::unique_lock<std::mutex>::~unique_lock(&parallel_lock);
      return bVar4;
    }
    if ((ulong)((long)(gstate->readers).
                      super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(gstate->readers).
                      super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <=
        (gstate->file_index).super___atomic_base<unsigned_long>._M_i) {
      bVar4 = TryGetNextFile(gstate,&parallel_lock);
      if (!bVar4) {
        unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
        ::operator*(this);
        unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
        ::operator*(local_78);
        goto LAB_01eae0e7;
      }
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
              ::get<true>(&gstate->readers,
                          (gstate->file_index).super___atomic_base<unsigned_long>._M_i);
    reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator*(this_00);
    if (reader_data->file_state == SKIPPED) {
      LOCK();
      (gstate->file_index).super___atomic_base<unsigned_long>._M_i =
           (gstate->file_index).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    else if (reader_data->file_state == OPEN) {
      pGVar5 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
               ::operator*(this);
      lstate_p = unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                 ::operator*(local_78);
      bVar4 = ParquetMultiFileInfo::TryInitializeScan(context,&reader_data->reader,pGVar5,lstate_p);
      if (bVar4) {
        if ((reader_data->reader).internal.
            super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_58,"MultiFileReader was moved",&local_81);
          InternalException::InternalException(this_01,&local_58);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar1 = gstate->batch_index;
        gstate->batch_index = iVar1 + 1;
        local_80->batch_index = iVar1;
        _Var2 = local_80->file_index;
        _Var3 = (gstate->file_index).super___atomic_base<unsigned_long>._M_i;
        local_80->file_index = _Var3;
        bVar4 = true;
        if (_Var2 != _Var3) {
          InitializeFileScanState(context,reader_data,local_80,&gstate->projection_ids);
        }
        goto LAB_01eae0e9;
      }
      LOCK();
      (gstate->file_index).super___atomic_base<unsigned_long>._M_i =
           (gstate->file_index).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      reader_data->file_state = CLOSED;
      pGVar5 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
               ::operator*(this);
      shared_ptr<duckdb::BaseFileReader,_true>::operator*(&reader_data->reader);
      pGVar5[1]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
      ::std::__weak_ptr<duckdb::BaseFileReader,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_ptr<duckdb::BaseFileReader,(__gnu_cxx::_Lock_policy)2> *)
                 &reader_data->closed_reader,
                 (__shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2> *)reader_data);
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      shared_ptr<duckdb::BaseFileReader,_true>::operator=
                (&reader_data->reader,(shared_ptr<duckdb::BaseFileReader,_true> *)&local_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
    }
    else {
      bVar4 = TryOpenNextFile(context,bind_data,local_80,gstate,&parallel_lock);
      if (!bVar4 && reader_data->file_state == OPENING) {
        WaitForFile((gstate->file_index).super___atomic_base<unsigned_long>._M_i,gstate,
                    &parallel_lock);
      }
    }
  } while( true );
}

Assistant:

static bool TryInitializeNextBatch(ClientContext &context, const MultiFileBindData &bind_data,
	                                   MultiFileLocalState &scan_data, MultiFileGlobalState &gstate) {
		unique_lock<mutex> parallel_lock(gstate.lock);

		while (true) {
			if (gstate.error_opening_file) {
				return false;
			}

			//! If we don't have a file to read, and the MultiFileList has no new file for us - end the scan
			if (!HasFilesToRead(gstate, parallel_lock) && !TryGetNextFile(gstate, parallel_lock)) {
				OP::FinishReading(context, *gstate.global_state, *scan_data.local_state);
				return false;
			}

			auto &current_reader_data = *gstate.readers[gstate.file_index];
			if (current_reader_data.file_state == MultiFileFileState::OPEN) {
				if (OP::TryInitializeScan(context, current_reader_data.reader, *gstate.global_state,
				                          *scan_data.local_state)) {
					if (!current_reader_data.reader) {
						throw InternalException("MultiFileReader was moved");
					}
					// The current reader has data left to be scanned
					scan_data.batch_index = gstate.batch_index++;
					auto old_file_index = scan_data.file_index;
					scan_data.file_index = gstate.file_index;
					if (old_file_index != scan_data.file_index) {
						InitializeFileScanState(context, current_reader_data, scan_data, gstate.projection_ids);
					}
					return true;
				} else {
					// Set state to the next file
					++gstate.file_index;

					// Close current file
					current_reader_data.file_state = MultiFileFileState::CLOSED;

					//! Finish processing the file
					OP::FinishFile(context, *gstate.global_state, *current_reader_data.reader);
					current_reader_data.closed_reader = current_reader_data.reader;
					current_reader_data.reader = nullptr;
					continue;
				}
			} else if (current_reader_data.file_state == MultiFileFileState::SKIPPED) {
				//! This file does not need to be opened or closed, the filters have determined that this file can be
				//! skipped entirely
				++gstate.file_index;
				continue;
			}

			if (TryOpenNextFile(context, bind_data, scan_data, gstate, parallel_lock)) {
				continue;
			}

			// Check if the current file is being opened, in that case we need to wait for it.
			if (current_reader_data.file_state == MultiFileFileState::OPENING) {
				WaitForFile(gstate.file_index, gstate, parallel_lock);
			}
		}
	}